

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O0

bool __thiscall
Opcode::AABBTreeOfAABBsBuilder::ComputeGlobalBox
          (AABBTreeOfAABBsBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  float fVar1;
  AABB *pAVar2;
  uint local_34;
  udword i;
  AABB *global_box_local;
  udword nb_prims_local;
  udword *primitives_local;
  AABBTreeOfAABBsBuilder *this_local;
  
  if ((primitives == (udword *)0x0) || (nb_prims == 0)) {
    this_local._7_1_ = false;
  }
  else {
    pAVar2 = this->mAABBArray + *primitives;
    fVar1 = (pAVar2->mCenter).y;
    (global_box->mCenter).x = (pAVar2->mCenter).x;
    (global_box->mCenter).y = fVar1;
    *(undefined8 *)&(global_box->mCenter).z = *(undefined8 *)&(pAVar2->mCenter).z;
    fVar1 = (pAVar2->mExtents).z;
    (global_box->mExtents).y = (pAVar2->mExtents).y;
    (global_box->mExtents).z = fVar1;
    for (local_34 = 1; local_34 < nb_prims; local_34 = local_34 + 1) {
      IceMaths::AABB::Add(global_box,this->mAABBArray + primitives[local_34]);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AABBTreeOfAABBsBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	global_box = mAABBArray[primitives[0]];

	// Loop through boxes
	for(udword i=1;i<nb_prims;i++)
	{
		// Update global box
		global_box.Add(mAABBArray[primitives[i]]);
	}
	return true;
}